

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btorsim.cpp
# Opt level: O0

void report(void)

{
  int64_t iVar1;
  bool bVar2;
  size_type sVar3;
  reference pvVar4;
  int64_t r;
  size_t i;
  vector<Btor2Line_*,_std::allocator<Btor2Line_*>_> *in_stack_fffffffffffffff0;
  ulong local_8;
  
  iVar1 = num_unreached_bads;
  if ((verbosity == 0) ||
     (sVar3 = std::vector<Btor2Line_*,_std::allocator<Btor2Line_*>_>::size(&bads),
     (long)sVar3 <= iVar1)) {
    bVar2 = std::vector<Btor2Line_*,_std::allocator<Btor2Line_*>_>::empty(in_stack_fffffffffffffff0)
    ;
    if (!bVar2) {
      msg(1,"no bad state property reached");
    }
  }
  else {
    printf("[btorsim] reached bad state properties {");
    for (local_8 = 0; sVar3 = std::vector<Btor2Line_*,_std::allocator<Btor2Line_*>_>::size(&bads),
        local_8 < sVar3; local_8 = local_8 + 1) {
      pvVar4 = std::vector<long,_std::allocator<long>_>::operator[](&reached_bads,local_8);
      in_stack_fffffffffffffff0 = (vector<Btor2Line_*,_std::allocator<Btor2Line_*>_> *)*pvVar4;
      if (-1 < (long)in_stack_fffffffffffffff0) {
        printf(" b%lu@%ld",local_8,in_stack_fffffffffffffff0);
      }
    }
    printf(" }\n");
  }
  if (constraints_violated < 0) {
    bVar2 = std::vector<Btor2Line_*,_std::allocator<Btor2Line_*>_>::empty(in_stack_fffffffffffffff0)
    ;
    if (!bVar2) {
      msg(1,"constraints always satisfied");
    }
  }
  else {
    msg(1,"constraints violated at time %ld",constraints_violated);
  }
  return;
}

Assistant:

static void
report ()
{
  if (verbosity && num_unreached_bads < (int64_t) bads.size ())
  {
    printf ("[btorsim] reached bad state properties {");
    for (size_t i = 0; i < bads.size (); i++)
    {
      int64_t r = reached_bads[i];
      if (r >= 0) printf (" b%lu@%" PRId64, i, r);
    }
    printf (" }\n");
  }
  else if (!bads.empty ())
    msg (1, "no bad state property reached");

  if (constraints_violated >= 0)
    msg (1, "constraints violated at time %" PRId64, constraints_violated);
  else if (!constraints.empty ())
    msg (1, "constraints always satisfied");
}